

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

bool absl::lts_20250127::str_format_internal::
     ParseFormatString<absl::lts_20250127::str_format_internal::ParsedFormatBase::ParsedFormatConsumer>
               (string_view src,ParsedFormatConsumer consumer)

{
  byte *p;
  bool bVar1;
  void *pvVar2;
  byte *__s;
  byte unaff_R13B;
  byte bVar3;
  byte *end;
  bool bVar4;
  string_view s;
  string_view s_00;
  string_view s_01;
  string_view s_02;
  string_view s_03;
  int next_arg;
  UnboundConversion conv;
  int local_54;
  UnboundConversion local_50;
  ParsedFormatConsumer local_40;
  
  __s = (byte *)src._M_str;
  local_40.data_pos = consumer.data_pos;
  local_40.parsed = consumer.parsed;
  local_54 = 0;
  bVar3 = 1;
  if (src._M_len != 0) {
    end = __s + src._M_len;
    bVar3 = unaff_R13B;
    do {
      pvVar2 = memchr(__s,0x25,(long)end - (long)__s);
      if (pvVar2 == (void *)0x0) {
        s_00._M_str = (char *)__s;
        s_00._M_len = (long)end - (long)__s;
        bVar3 = ParsedFormatBase::ParsedFormatConsumer::Append(&local_40,s_00);
        bVar4 = true;
      }
      else {
        s._M_len = (long)pvVar2 - (long)__s;
        s._M_str = (char *)__s;
        bVar1 = ParsedFormatBase::ParsedFormatConsumer::Append(&local_40,s);
        bVar4 = true;
        if ((bVar1) && (p = (byte *)((long)pvVar2 + 1), p < end)) {
          if ((char)ConvTagHolder::value[*p].tag_ < '\0') {
            if (*p == 0x25) {
              s_01._M_str = "%";
              s_01._M_len = 1;
              bVar1 = ParsedFormatBase::ParsedFormatConsumer::Append(&local_40,s_01);
              if (!bVar1) goto LAB_01069b57;
              __s = (byte *)((long)pvVar2 + 2);
              bVar4 = false;
            }
            else {
              local_50.width.value_ = -1;
              local_50.precision.value_ = -1;
              local_50.flags = kBasic;
              local_50.length_mod = none;
              local_50.conv = v|s;
              __s = (byte *)ConsumeUnboundConversionNoInline
                                      ((char *)p,(char *)end,&local_50,&local_54);
              if (__s == (byte *)0x0) {
                bVar3 = 0;
                bVar1 = false;
              }
              else {
                s_03._M_len = (long)__s - (long)p;
                s_03._M_str = (char *)p;
                bVar1 = ParsedFormatBase::ParsedFormatConsumer::ConvertOne(&local_40,&local_50,s_03)
                ;
                bVar3 = bVar3 & bVar1;
              }
              if (bVar1 != false) goto LAB_01069b43;
            }
          }
          else {
            if (local_54 < 0) goto LAB_01069b57;
            __s = (byte *)((long)pvVar2 + 2);
            local_50.width.value_ = -1;
            local_50.precision.value_ = -1;
            local_50.flags = kBasic;
            local_50.length_mod = none;
            local_54 = local_54 + 1;
            s_02._M_str = (char *)p;
            s_02._M_len = 1;
            local_50.arg_position = local_54;
            local_50.conv = ConvTagHolder::value[*p].tag_;
            bVar1 = ParsedFormatBase::ParsedFormatConsumer::ConvertOne(&local_40,&local_50,s_02);
            bVar3 = bVar3 & bVar1;
            if (bVar1) {
LAB_01069b43:
              bVar4 = false;
            }
          }
        }
        else {
LAB_01069b57:
          bVar3 = 0;
        }
      }
      if (bVar4) goto LAB_01069b6a;
    } while (__s != end);
    bVar3 = 1;
  }
LAB_01069b6a:
  return (bool)(bVar3 & 1);
}

Assistant:

bool ParseFormatString(string_view src, Consumer consumer) {
  int next_arg = 0;
  const char* p = src.data();
  const char* const end = p + src.size();
  while (p != end) {
    const char* percent =
        static_cast<const char*>(memchr(p, '%', static_cast<size_t>(end - p)));
    if (!percent) {
      // We found the last substring.
      return consumer.Append(string_view(p, static_cast<size_t>(end - p)));
    }
    // We found a percent, so push the text run then process the percent.
    if (ABSL_PREDICT_FALSE(!consumer.Append(
            string_view(p, static_cast<size_t>(percent - p))))) {
      return false;
    }
    if (ABSL_PREDICT_FALSE(percent + 1 >= end)) return false;

    auto tag = GetTagForChar(percent[1]);
    if (tag.is_conv()) {
      if (ABSL_PREDICT_FALSE(next_arg < 0)) {
        // This indicates an error in the format string.
        // The only way to get `next_arg < 0` here is to have a positional
        // argument first which sets next_arg to -1 and then a non-positional
        // argument.
        return false;
      }
      p = percent + 2;

      // Keep this case separate from the one below.
      // ConvertOne is more efficient when the compiler can see that the `basic`
      // flag is set.
      UnboundConversion conv;
      conv.conv = tag.as_conv();
      conv.arg_position = ++next_arg;
      if (ABSL_PREDICT_FALSE(
              !consumer.ConvertOne(conv, string_view(percent + 1, 1)))) {
        return false;
      }
    } else if (percent[1] != '%') {
      UnboundConversion conv;
      p = ConsumeUnboundConversionNoInline(percent + 1, end, &conv, &next_arg);
      if (ABSL_PREDICT_FALSE(p == nullptr)) return false;
      if (ABSL_PREDICT_FALSE(!consumer.ConvertOne(
              conv, string_view(percent + 1,
                                static_cast<size_t>(p - (percent + 1)))))) {
        return false;
      }
    } else {
      if (ABSL_PREDICT_FALSE(!consumer.Append("%"))) return false;
      p = percent + 2;
      continue;
    }
  }
  return true;
}